

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
::set_empty_key(dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
                *this,key_type *key)

{
  byte bVar1;
  type tVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  pointer piVar5;
  long lVar6;
  ulong uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  
  (this->settings).super_sh_hashtable_settings<int,_Hasher,_unsigned_char,_4>.use_empty_ = true;
  (this->key_info).empty_key = *key;
  bVar1 = this->num_buckets;
  piVar3 = (this->val_info).super_alloc_impl<Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>.
           super_Alloc<int,_unsigned_char,_(unsigned_char)__n_>.count_;
  if (piVar3 != (int *)0x0) {
    *piVar3 = *piVar3 + 1;
  }
  piVar5 = (pointer)malloc((ulong)((uint)bVar1 * 4));
  this->table = piVar5;
  auVar4 = _DAT_00a8f670;
  if ((ulong)bVar1 != 0) {
    tVar2 = (this->key_info).empty_key;
    lVar6 = (ulong)bVar1 - 1;
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_00a8f670;
    auVar10 = _DAT_00a8f650;
    auVar11 = _DAT_00a8f660;
    do {
      auVar12 = auVar11 ^ auVar4;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar12._4_4_ == iVar9 && auVar8._0_4_ < auVar12._0_4_ || iVar9 < auVar12._4_4_)
                & 1)) {
        *(type *)((long)piVar5 + uVar7) = tVar2;
      }
      if ((auVar12._12_4_ != auVar8._12_4_ || auVar12._8_4_ <= auVar8._8_4_) &&
          auVar12._12_4_ <= auVar8._12_4_) {
        *(type *)((long)piVar5 + uVar7 + 4) = tVar2;
      }
      auVar12 = auVar10 ^ auVar4;
      iVar13 = auVar12._4_4_;
      if (iVar13 <= iVar9 && (iVar13 != iVar9 || auVar12._0_4_ <= auVar8._0_4_)) {
        *(type *)((long)piVar5 + uVar7 + 8) = tVar2;
        *(type *)((long)piVar5 + uVar7 + 0xc) = tVar2;
      }
      lVar6 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar6 + 4;
      lVar6 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar6 + 4;
      uVar7 = uVar7 + 0x10;
    } while (((uint)bVar1 * 4 + 0xc & 0xfffffff0) != uVar7);
  }
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }